

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O1

bool loadTextures(void)

{
  bool bVar1;
  
  bVar1 = loadSceneFramebufferTexture();
  if (bVar1) {
    bVar1 = loadBackFramebufferTexture();
  }
  if (bVar1 != false) {
    bVar1 = loadEnvmapTexture();
  }
  if (bVar1 != false) {
    bVar1 = loadNpfTexture();
  }
  if (bVar1 != false) {
    bVar1 = loadMerlTexture();
    return bVar1;
  }
  return false;
}

Assistant:

bool loadTextures()
{
    bool v = true;

    if (v) v&= loadSceneFramebufferTexture();
    if (v) v&= loadBackFramebufferTexture();
    if (v) v&= loadEnvmapTexture();
    if (v) v&= loadNpfTexture();
    if (v) v&= loadMerlTexture();

    return v;
}